

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceDecomposition::unpackPreForceData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  value_type vVar1;
  reference pvVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  Vector<double,_7U> *in_stack_ffffffffffffffd0;
  double dVar3;
  Vector<double,_7U> *in_stack_ffffffffffffffd8;
  
  Vector<double,_7U>::operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Vector<double,_7U>::operator=(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if ((*(uint *)(in_RDI + 0x30) & 0x100) != 0) {
    dVar3 = *(double *)(in_RSI + 0x60);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0xc0)
                        ,(long)in_EDX);
    *pvVar2 = dVar3 + *pvVar2;
  }
  if ((*(uint *)(in_RDI + 0x30) & 0x200) != 0) {
    dVar3 = *(double *)(in_RSI + 0x68);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0xd8)
                        ,(long)in_EDX);
    *pvVar2 = dVar3 + *pvVar2;
  }
  if (((*(byte *)(in_RSI + 0x48) & 1) != 0) && ((*(uint *)(in_RDI + 0x30) & 0x40) != 0)) {
    vVar1 = *(value_type *)(in_RSI + 0x50);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x18) + 0x90)
                        ,(long)in_EDX);
    *pvVar2 = vVar1;
  }
  return;
}

Assistant:

void ForceDecomposition::unpackPreForceData(SelfData& sdat, int atom) {
    selfPot         = sdat.selfPot;
    selectedSelfPot = sdat.selePot;

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      snap_->atomData.functional[atom] += sdat.frho;
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      snap_->atomData.functionalDerivative[atom] += sdat.dfrhodrho;
    }

    if (sdat.doParticlePot &&
        (atomStorageLayout_ & DataStorage::dslParticlePot)) {
      snap_->atomData.particlePot[atom] = sdat.particlePot;
    }
  }